

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<short,short>(void)

{
  short u2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  short t;
  short u;
  undefined2 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0a;
  undefined2 in_stack_ffffffffffffff0c;
  short in_stack_ffffffffffffff0e;
  undefined2 in_stack_ffffffffffffff10;
  short in_stack_ffffffffffffff12;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff14;
  short in_stack_ffffffffffffff16;
  undefined2 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1a;
  undefined2 in_stack_ffffffffffffff1c;
  undefined2 in_stack_ffffffffffffff1e;
  undefined2 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff22;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff24;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff26;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_a;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_8;
  byte local_5;
  short local_4;
  short local_2;
  
  local_2 = 0;
  local_4 = 0;
  local_5 = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_8,&local_2);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_a,&local_2);
  local_5 = (local_5 ^ 0xff) & 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (short *)CONCAT26(in_stack_ffffffffffffff1e,
                               CONCAT24(in_stack_ffffffffffffff1c,
                                        CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18
                                                ))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (short *)CONCAT26(in_stack_ffffffffffffff1e,
                               CONCAT24(in_stack_ffffffffffffff1c,
                                        CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18
                                                ))));
  local_8.m_int = local_a.m_int;
  SafeInt::operator_cast_to_short
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator*(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  local_2 = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  local_2 = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator/(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator+(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  local_2 = 0;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator-(0x18,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  )0x0);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  local_2 = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff26.m_int,
                         CONCAT24(in_stack_ffffffffffffff24.m_int,
                                  CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),
             (int *)CONCAT26(in_stack_ffffffffffffff1e,
                             CONCAT24(in_stack_ffffffffffffff1c,
                                      CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff16);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator<<(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff16);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator>>(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff24);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator&(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),
             in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator|(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),
             in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff0e,
                         CONCAT24(in_stack_ffffffffffffff0c,
                                  CONCAT22(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))),0)
  ;
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  operator^(in_stack_ffffffffffffff12,in_stack_ffffffffffffff14);
  local_4 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_ffffffffffffff16,
                                   CONCAT24(in_stack_ffffffffffffff14.m_int,
                                            CONCAT22(in_stack_ffffffffffffff12,
                                                     in_stack_ffffffffffffff10))));
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14.m_int,
                                  CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))),
             in_stack_ffffffffffffff0e);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT26(in_stack_ffffffffffffff1e,
                         CONCAT24(in_stack_ffffffffffffff1c,
                                  CONCAT22(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff26);
  local_5 = operator<((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator<((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,0);
  local_5 = operator<(0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         )0x0);
  local_5 = operator<((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator<=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator<=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
  local_5 = operator<=(0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x0);
  local_5 = operator<=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,0);
  local_5 = operator>(0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         )0x0);
  local_5 = operator>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                             )0x0);
  local_5 = operator>=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator>=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
  local_5 = operator>=(0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x0);
  local_5 = operator>=((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator==((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              )0x0);
  local_5 = operator==((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,0);
  local_5 = operator==(0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x0);
  operator==((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             )0x0,(SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   )0x0);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}